

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O1

ssize_t __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::write(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
        *this,int __fd,void *__buf,size_t __n)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_> bVar6;
  byte bVar7;
  char *__last;
  long lVar8;
  uint uVar9;
  int iVar10;
  char local_35 [13];
  
  uVar4 = 0x1f;
  if ((__fd | 1U) != 0) {
    for (; (__fd | 1U) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar9 = (uVar4 - ((uint)__fd <
                   *(uint *)(basic_data<void>::ZERO_OR_POWERS_OF_10_32 + (ulong)uVar4 * 4))) + 1;
  iVar10 = (int)__buf;
  if ((int)uVar9 < iVar10) {
    pbVar1 = (this->out).container;
    if ((int)uVar9 < iVar10) {
      iVar10 = (iVar10 - uVar4) +
               (uint)((uint)__fd <
                     *(uint *)(basic_data<void>::ZERO_OR_POWERS_OF_10_32 + (ulong)uVar4 * 4));
      do {
        if ((pbVar1->super_basic_buffer<char>).capacity_ <
            (pbVar1->super_basic_buffer<char>).size_ + 1) {
          (**(pbVar1->super_basic_buffer<char>)._vptr_basic_buffer)(pbVar1);
        }
        sVar2 = (pbVar1->super_basic_buffer<char>).size_;
        (pbVar1->super_basic_buffer<char>).size_ = sVar2 + 1;
        (pbVar1->super_basic_buffer<char>).ptr_[sVar2] = '0';
        iVar10 = iVar10 + -1;
      } while (1 < iVar10);
    }
    (this->out).container = pbVar1;
  }
  __last = local_35 + uVar9;
  pcVar5 = __last;
  uVar4 = __fd;
  if (99 < (uint)__fd) {
    do {
      __fd = uVar4 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)(basic_data<void>::DIGITS + (ulong)(uVar4 % 100) * 2);
      pcVar5 = pcVar5 + -2;
      bVar3 = 9999 < uVar4;
      uVar4 = uVar4 / 100;
    } while (bVar3);
  }
  bVar6.container = (this->out).container;
  if ((uint)__fd < 10) {
    bVar7 = (byte)__fd | 0x30;
    lVar8 = -1;
  }
  else {
    pcVar5[-1] = basic_data<void>::DIGITS[((ulong)(uint)__fd * 2 & 0xffffffff) + 1];
    bVar7 = basic_data<void>::DIGITS[(ulong)(uint)__fd * 2];
    lVar8 = -2;
  }
  pcVar5[lVar8] = bVar7;
  bVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,500ul,std::allocator<char>>>>
                    (local_35,__last,bVar6);
  (this->out).container = bVar6.container;
  return (ssize_t)bVar6.container;
}

Assistant:

void write(int value, int width) {
    typedef typename int_traits<int>::main_type main_type;
    main_type n = to_unsigned(value);
    int num_digits = internal::count_digits(n);
    if (width > num_digits)
      out = std::fill_n(out, width - num_digits, '0');
    out = format_decimal<char_type>(out, n, num_digits);
  }